

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O1

Result __thiscall
wabt::interp::Memory::AtomicRmwCmpxchg<unsigned_long>
          (Memory *this,u64 offset,u64 addend,unsigned_long expect,unsigned_long replace,
          unsigned_long *out)

{
  pointer puVar1;
  bool bVar2;
  Enum EVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  
  puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  bVar6 = offset <= uVar5;
  bVar7 = addend <= uVar5;
  bVar8 = 7 < uVar5;
  bVar2 = addend + offset + 8 <= uVar5;
  uVar4 = addend + offset;
  bVar9 = (uVar4 & 7) == 0;
  if (bVar9 && ((bVar8 && (bVar7 && bVar6)) && bVar2)) {
    offset = *(u64 *)(puVar1 + uVar4);
  }
  EVar3 = Error;
  if (bVar9 && ((bVar8 && (bVar7 && bVar6)) && bVar2)) {
    if (offset == expect) {
      if ((uVar4 & 7) != 0) {
        return (Result)Error;
      }
      if ((!bVar8 || (!bVar7 || !bVar6)) || uVar5 < uVar4 + 8) {
        return (Result)Error;
      }
      *(unsigned_long *)(puVar1 + uVar4) = replace;
    }
    *out = offset;
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

inline bool Module::classof(const Object* obj) {
  return obj->kind() == skind;
}